

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int PrintAction(action *ap,FILE *fp,int indent)

{
  rule *prVar1;
  bool bVar2;
  rule *rp_1;
  rule *rp;
  state *stp;
  int result;
  int indent_local;
  FILE *fp_local;
  action *ap_local;
  
  stp._0_4_ = 1;
  switch(ap->type) {
  case SHIFT:
    fprintf((FILE *)fp,"%*s shift        %-7d",(ulong)(uint)indent,ap->sp->name,
            (ulong)(uint)((ap->x).stp)->statenum);
    break;
  case ACCEPT:
    fprintf((FILE *)fp,"%*s accept",(ulong)(uint)indent,ap->sp->name);
    break;
  case REDUCE:
    prVar1 = (ap->x).rp;
    fprintf((FILE *)fp,"%*s reduce       %-7d",(ulong)(uint)indent,ap->sp->name,
            (ulong)(uint)prVar1->iRule);
    RulePrint(fp,prVar1,-1);
    break;
  case ERROR:
    fprintf((FILE *)fp,"%*s error",(ulong)(uint)indent,ap->sp->name);
    break;
  case SSCONFLICT:
    fprintf((FILE *)fp,"%*s shift        %-7d ** Parsing conflict **",(ulong)(uint)indent,
            ap->sp->name,(ulong)(uint)((ap->x).stp)->statenum);
    break;
  case SRCONFLICT:
  case RRCONFLICT:
    fprintf((FILE *)fp,"%*s reduce       %-7d ** Parsing conflict **",(ulong)(uint)indent,
            ap->sp->name,(ulong)(uint)((ap->x).rp)->iRule);
    break;
  case SH_RESOLVED:
    bVar2 = showPrecedenceConflict != 0;
    if (bVar2) {
      fprintf((FILE *)fp,"%*s shift        %-7d -- dropped by precedence",(ulong)(uint)indent,
              ap->sp->name,(ulong)(uint)((ap->x).stp)->statenum);
    }
    stp._0_4_ = (uint)bVar2;
    break;
  case RD_RESOLVED:
    bVar2 = showPrecedenceConflict != 0;
    if (bVar2) {
      fprintf((FILE *)fp,"%*s reduce %-7d -- dropped by precedence",(ulong)(uint)indent,ap->sp->name
              ,(ulong)(uint)((ap->x).rp)->iRule);
    }
    stp._0_4_ = (uint)bVar2;
    break;
  case NOT_USED:
    stp._0_4_ = 0;
    break;
  case SHIFTREDUCE:
    prVar1 = (ap->x).rp;
    fprintf((FILE *)fp,"%*s shift-reduce %-7d",(ulong)(uint)indent,ap->sp->name,
            (ulong)(uint)prVar1->iRule);
    RulePrint(fp,prVar1,-1);
  }
  if (((uint)stp != 0) && (ap->spOpt != (symbol *)0x0)) {
    fprintf((FILE *)fp,"  /* because %s==%s */",ap->sp->name,ap->spOpt->name);
  }
  return (uint)stp;
}

Assistant:

int PrintAction(
  struct action *ap,          /* The action to print */
  FILE *fp,                   /* Print the action here */
  int indent                  /* Indent by this amount */
){
  int result = 1;
  switch( ap->type ){
    case SHIFT: {
      struct state *stp = ap->x.stp;
      fprintf(fp,"%*s shift        %-7d",indent,ap->sp->name,stp->statenum);
      break;
    }
    case REDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s reduce       %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case SHIFTREDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s shift-reduce %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case ACCEPT:
      fprintf(fp,"%*s accept",indent,ap->sp->name);
      break;
    case ERROR:
      fprintf(fp,"%*s error",indent,ap->sp->name);
      break;
    case SRCONFLICT:
    case RRCONFLICT:
      fprintf(fp,"%*s reduce       %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.rp->iRule);
      break;
    case SSCONFLICT:
      fprintf(fp,"%*s shift        %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.stp->statenum);
      break;
    case SH_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s shift        %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.stp->statenum);
      }else{
        result = 0;
      }
      break;
    case RD_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s reduce %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.rp->iRule);
      }else{
        result = 0;
      }
      break;
    case NOT_USED:
      result = 0;
      break;
  }
  if( result && ap->spOpt ){
    fprintf(fp,"  /* because %s==%s */", ap->sp->name, ap->spOpt->name);
  }
  return result;
}